

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O3

Reader capnp::_::anon_unknown_129::name(DynamicEnum e)

{
  undefined4 uVar1;
  bool bVar2;
  ArrayPtr<const_char> AVar3;
  NullableValue<capnp::EnumSchema::Enumerant> local_68;
  DynamicEnum local_18;
  
  DynamicEnum::getEnumerant((Maybe<capnp::EnumSchema::Enumerant> *)&local_68,&local_18);
  if (local_68.isSet == true) {
    bVar2 = local_68.field_1.value.proto._reader.pointerCount == 0;
    local_68.field_1.value._8_8_ = local_68.field_1.value.proto._reader.pointers;
    if (bVar2) {
      local_68.field_1._8_8_ = (WirePointer *)0x0;
    }
    uVar1 = 0x7fffffff;
    if (!bVar2) {
      uVar1 = local_68.field_1.value.proto._reader.nestingLimit;
    }
    local_68.isSet = false;
    local_68._1_3_ = 0;
    local_68._4_4_ = 0;
    local_68.field_1._0_4_ = 0;
    local_68.field_1._4_4_ = 0;
    if (!bVar2) {
      local_68._0_4_ = local_68.field_1._16_4_;
      local_68._4_4_ = local_68.field_1._20_4_;
      local_68.field_1._0_4_ = local_68.field_1._24_4_;
      local_68.field_1._4_4_ = local_68.field_1._28_4_;
    }
    local_68.field_1._16_4_ = uVar1;
    AVar3 = (ArrayPtr<const_char>)
            PointerReader::getBlob<capnp::Text>((PointerReader *)&local_68,(void *)0x0,0);
  }
  else {
    AVar3.size_ = 0x14;
    AVar3.ptr = "(unknown enumerant)";
  }
  return (StringPtr)(StringPtr)AVar3;
}

Assistant:

Text::Reader name(DynamicEnum e) {
  KJ_IF_MAYBE(schema, e.getEnumerant()) {
    return schema->getProto().getName();
  } else {
    return "(unknown enumerant)";
  }
}